

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O1

string * __thiscall
cfgfile::generator::generate_type_of_data_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,field_t *f)

{
  size_type *psVar1;
  pointer pcVar2;
  undefined8 uVar3;
  char *pcVar4;
  field_type_t fVar5;
  string *psVar6;
  long *plVar7;
  undefined8 *puVar8;
  ulong *puVar9;
  char *pcVar10;
  ulong uVar11;
  ulong *local_80;
  long local_78;
  ulong local_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  ulong *local_60;
  long local_58;
  ulong local_50 [2];
  long *local_40 [2];
  long local_30 [2];
  
  fVar5 = cfg::field_t::type((field_t *)this);
  switch(fVar5) {
  case scalar_field_type:
  case custom_tag_field_type:
    psVar6 = cfg::field_t::value_type_abi_cxx11_((field_t *)this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (psVar6->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + psVar6->_M_string_length);
    return __return_storage_ptr__;
  case no_value_field_type:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = "bool";
    pcVar4 = "bool";
    break;
  case scalar_vector_field_type:
  case vector_of_tags_field_type:
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"std::vector< ","");
    psVar6 = cfg::field_t::value_type_abi_cxx11_((field_t *)this);
    plVar7 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_40,(ulong)(psVar6->_M_dataplus)._M_p);
    puVar9 = (ulong *)(plVar7 + 2);
    if ((ulong *)*plVar7 == puVar9) {
      local_70 = *puVar9;
      uStack_68 = (undefined4)plVar7[3];
      uStack_64 = *(undefined4 *)((long)plVar7 + 0x1c);
      local_80 = &local_70;
    }
    else {
      local_70 = *puVar9;
      local_80 = (ulong *)*plVar7;
    }
    local_78 = plVar7[1];
    *plVar7 = (long)puVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60," >","");
    uVar11 = 0xf;
    if (local_80 != &local_70) {
      uVar11 = local_70;
    }
    if (uVar11 < (ulong)(local_58 + local_78)) {
      uVar11 = 0xf;
      if (local_60 != local_50) {
        uVar11 = local_50[0];
      }
      if ((ulong)(local_58 + local_78) <= uVar11) {
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,(ulong)local_80);
        goto LAB_0011bf33;
      }
    }
    puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_60);
LAB_0011bf33:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar1 = puVar8 + 2;
    if ((size_type *)*puVar8 == psVar1) {
      uVar3 = puVar8[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar8;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    }
    __return_storage_ptr__->_M_string_length = puVar8[1];
    *puVar8 = psVar1;
    puVar8[1] = 0;
    *(undefined1 *)psVar1 = 0;
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    if (local_40[0] == local_30) {
      return __return_storage_ptr__;
    }
    operator_delete(local_40[0],local_30[0] + 1);
    return __return_storage_ptr__;
  default:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = "void";
    pcVar4 = "void";
  }
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar10,pcVar4 + 4);
  return __return_storage_ptr__;
}

Assistant:

static inline std::string generate_type_of_data( const cfg::field_t & f )
{
	switch( f.type() )
	{
		case cfg::field_t::no_value_field_type :
			return std::string( "bool" );

		case cfg::field_t::custom_tag_field_type :
		case cfg::field_t::scalar_field_type :
			return f.value_type();

		case cfg::field_t::vector_of_tags_field_type :
		case cfg::field_t::scalar_vector_field_type :
			return std::string( "std::vector< " ) + f.value_type() + std::string( " >" );

		default :
			return std::string( "void" );
	}
}